

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

int lyplg_type_sort_int(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  char cVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  
  switch(val1->realtype->basetype) {
  case LY_TYPE_INT8:
    cVar1 = (val2->field_2).boolean;
    cVar2 = (val1->field_2).boolean;
    bVar11 = SBORROW1(cVar2,cVar1);
    bVar10 = (char)(cVar2 - cVar1) < '\0';
    bVar9 = cVar2 == cVar1;
    if (cVar2 < cVar1) {
      return -1;
    }
    break;
  case LY_TYPE_INT16:
    sVar3 = (val2->field_2).int16;
    sVar4 = (val1->field_2).int16;
    bVar11 = SBORROW2(sVar4,sVar3);
    bVar10 = (short)(sVar4 - sVar3) < 0;
    bVar9 = sVar4 == sVar3;
    if (sVar4 < sVar3) {
      return -1;
    }
    break;
  case LY_TYPE_INT32:
    iVar5 = (val2->field_2).int32;
    iVar6 = (val1->field_2).int32;
    bVar11 = SBORROW4(iVar6,iVar5);
    bVar10 = iVar6 - iVar5 < 0;
    bVar9 = iVar6 == iVar5;
    if (iVar6 < iVar5) {
      return -1;
    }
    break;
  case LY_TYPE_INT64:
    lVar7 = (val2->field_2).dec64;
    lVar8 = (val1->field_2).dec64;
    bVar11 = SBORROW8(lVar8,lVar7);
    bVar10 = lVar8 - lVar7 < 0;
    bVar9 = lVar8 == lVar7;
    if (lVar8 < lVar7) {
      return -1;
    }
    break;
  default:
    return 0;
  }
  return (uint)(!bVar9 && bVar11 == bVar10);
}

Assistant:

LIBYANG_API_DEF int
lyplg_type_sort_int(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    switch (val1->realtype->basetype) {
    case LY_TYPE_INT8:
        if (val1->int8 < val2->int8) {
            return -1;
        } else if (val1->int8 > val2->int8) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_INT16:
        if (val1->int16 < val2->int16) {
            return -1;
        } else if (val1->int16 > val2->int16) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_INT32:
        if (val1->int32 < val2->int32) {
            return -1;
        } else if (val1->int32 > val2->int32) {
            return 1;
        } else {
            return 0;
        }
        break;
    case LY_TYPE_INT64:
        if (val1->int64 < val2->int64) {
            return -1;
        } else if (val1->int64 > val2->int64) {
            return 1;
        } else {
            return 0;
        }
        break;
    default:
        break;
    }
    return 0;
}